

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolj.c
# Opt level: O2

int ffgclj(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          long elemincre,int nultyp,long nulval,long *array,char *nularray,int *anynul,int *status)

{
  long *output;
  uint uVar1;
  fitsfile *fptr_00;
  int iVar2;
  ulong uVar3;
  char *nullarray;
  long lVar4;
  long lVar5;
  long nvals;
  bool bVar6;
  double dVar7;
  double dVar8;
  int local_71fc;
  double zero;
  double scale;
  int tcode;
  LONGLONG tnull;
  ulong local_71c8;
  uint local_71c0;
  int hdutype;
  long incre;
  long local_71b0;
  long local_71a8;
  fitsfile *local_71a0;
  int maxelem2;
  LONGLONG repeat;
  long twidth;
  double local_7180;
  long local_7178;
  LONGLONG rowlen;
  LONGLONG startpos;
  int decimals;
  int xcode;
  char snull [20];
  char tform [20];
  long xwidth;
  char message [81];
  double cbuff [3600];
  
  iVar2 = *status;
  if (nelem != 0 && iVar2 < 1) {
    if (anynul != (int *)0x0) {
      *anynul = 0;
    }
    local_71a0 = fptr;
    if (nultyp == 2) {
      memset(nularray,0,nelem);
    }
    iVar2 = ffgcprll(local_71a0,colnum,firstrow,firstelem,nelem,(int)(elemincre >> 0x3f),&scale,
                     &zero,tform,&twidth,&tcode,&maxelem2,&startpos,(LONGLONG *)&local_71c8,&incre,
                     &repeat,&rowlen,&hdutype,&tnull,snull,status);
    if (iVar2 < 1) {
      incre = incre * elemincre;
      local_71c0 = colnum;
      if (tcode == 0x10) {
        ffasfm(tform,&xcode,&xwidth,&decimals,status);
        uVar1 = 0;
        if (0 < decimals) {
          uVar1 = decimals;
        }
        uVar3 = (ulong)uVar1;
        local_7180 = 1.0;
        while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
          local_7180 = local_7180 * 10.0;
        }
      }
      else {
        local_7180 = 1.0;
      }
      local_71fc = 0;
      if (nultyp != 1 || nulval != 0) {
        uVar3 = CONCAT44(tnull._4_4_,CONCAT22(tnull._2_2_,CONCAT11(tnull._1_1_,(uchar)tnull)));
        if (((tcode % 10 != 1 || uVar3 != 0x4995cdd1) &&
            (tcode != 0x15 || (long)CONCAT11(tnull._1_1_,(uchar)tnull) == uVar3)) &&
           (tcode != 0xb || uVar3 < 0x100)) {
          local_71fc = 0;
          if (snull[0] != '\x01') {
            local_71fc = nultyp;
          }
          if (tcode != 0x10) {
            local_71fc = nultyp;
          }
        }
      }
      local_7178 = -elemincre;
      local_71a8 = 0;
      local_71b0 = 0;
LAB_0018d8fc:
      nullarray = nularray + local_71b0;
      output = array + local_71b0;
      do {
        fptr_00 = local_71a0;
        if (nelem == 0) {
          if (*status != -0xb) {
            return *status;
          }
          ffpmsg("Numerical overflow during type conversion while reading FITS data.");
          *status = 0x19c;
          return 0x19c;
        }
        lVar5 = (long)maxelem2;
        if (nelem < maxelem2) {
          lVar5 = nelem;
        }
        if (elemincre < 0) {
          lVar4 = (long)local_71c8 / local_7178;
        }
        else {
          lVar4 = (long)(~local_71c8 + repeat) / elemincre;
        }
        nvals = lVar4 + 1;
        if (lVar5 <= lVar4) {
          nvals = lVar5;
        }
        lVar5 = (incre / elemincre) * local_71c8 + rowlen * local_71a8 + startpos;
        if (tcode == 0xb) {
          ffgi1b(local_71a0,lVar5,nvals,incre,(uchar *)cbuff,status);
          fffi1i4((uchar *)cbuff,nvals,scale,zero,local_71fc,(uchar)tnull,nulval,nullarray,anynul,
                  output,status);
        }
        else if (tcode == 0x10) {
          ffmbyt(local_71a0,lVar5,0,status);
          if (incre - twidth == 0) {
            ffgbyt(fptr_00,incre * nvals,cbuff,status);
          }
          else {
            ffgbytoff(fptr_00,twidth,nvals,incre - twidth,cbuff,status);
          }
          fffstri4((char *)cbuff,nvals,scale,zero,twidth,local_7180,local_71fc,snull,nulval,
                   nullarray,anynul,output,status);
        }
        else if (tcode == 0x15) {
          ffgi2b(local_71a0,lVar5,nvals,incre,(short *)cbuff,status);
          fffi2i4((short *)cbuff,nvals,scale,zero,local_71fc,CONCAT11(tnull._1_1_,(uchar)tnull),
                  nulval,nullarray,anynul,output,status);
        }
        else if (tcode == 0x52) {
          ffgr8b(local_71a0,lVar5,nvals,incre,cbuff,status);
          fffr8i4(cbuff,nvals,scale,zero,local_71fc,nulval,nullarray,anynul,output,status);
        }
        else if (tcode == 0x2a) {
          ffgr4b(local_71a0,lVar5,nvals,incre,(float *)cbuff,status);
          fffr4i4((float *)cbuff,nvals,scale,zero,local_71fc,nulval,nullarray,anynul,output,status);
        }
        else if (tcode == 0x51) {
          ffgi8b(local_71a0,lVar5,nvals,incre,(long *)cbuff,status);
          fffi8i4((LONGLONG *)cbuff,nvals,scale,zero,local_71fc,
                  CONCAT44(tnull._4_4_,CONCAT22(tnull._2_2_,CONCAT11(tnull._1_1_,(uchar)tnull))),
                  nulval,nullarray,anynul,output,status);
        }
        else {
          if (tcode != 0x29) {
            snprintf(message,0x51,"Cannot read numbers from column %d which has format %s",
                     (ulong)local_71c0,tform);
            ffpmsg(message);
            if (hdutype == 1) {
              *status = 0x137;
              return 0x137;
            }
            *status = 0x138;
            return 0x138;
          }
          ffgi4b(local_71a0,lVar5,nvals,incre,(int *)cbuff,status);
          fffi4i4((int *)cbuff,nvals,scale,zero,local_71fc,
                  CONCAT22(tnull._2_2_,CONCAT11(tnull._1_1_,(uchar)tnull)),nulval,nullarray,anynul,
                  output,status);
        }
        if (0 < *status) {
          dVar7 = (double)local_71b0 + 1.0;
          dVar8 = (double)nvals + (double)local_71b0;
          if (hdutype < 1) {
            snprintf(message,0x51,"Error reading elements %.0f thru %.0f from image (ffgclj).",dVar7
                     ,dVar8);
          }
          else {
            snprintf(message,0x51,"Error reading elements %.0f thru %.0f from column %d (ffgclj).",
                     dVar7,dVar8,(ulong)local_71c0);
          }
          ffpmsg(message);
          return *status;
        }
        nelem = nelem - nvals;
      } while (nelem == 0);
      local_71b0 = local_71b0 + nvals;
      local_71c8 = nvals * elemincre + local_71c8;
      if ((long)local_71c8 < repeat) goto code_r0x0018dccc;
      lVar5 = (long)local_71c8 / repeat;
      local_71c8 = (long)local_71c8 % repeat;
      goto LAB_0018dd01;
    }
    iVar2 = *status;
  }
  return iVar2;
code_r0x0018dccc:
  if ((long)local_71c8 < 0) {
    lVar4 = (long)~local_71c8 / repeat + 1;
    lVar5 = -lVar4;
    local_71c8 = lVar4 * repeat + local_71c8;
LAB_0018dd01:
    local_71a8 = local_71a8 + lVar5;
  }
  goto LAB_0018d8fc;
}

Assistant:

int ffgclj( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  elemincre,  /* I - pixel increment; e.g., 2 = every other  */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            long  nulval,     /* I - value for null pixels if nultyp = 1     */
            long  *array,     /* O - array of values that are read           */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer be a virtual column in a 1 or more grouped FITS primary
  array or image extension.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The output array of values will be converted from the datatype of the column 
  and will be scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    double scale, zero, power = 1., dtemp;
    int tcode, maxelem2, hdutype, xcode, decimals;
    long twidth, incre;
    long ii, xwidth, ntodo;
    int convert, nulcheck, readcheck = 0;
    LONGLONG repeat, startpos, elemnum, readptr, tnull;
    LONGLONG rowlen, rownum, remain, next, rowincre, maxelem;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value if reading from ASCII table  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)
        memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (elemincre < 0)
        readcheck = -1;  /* don't do range checking in this case */

    if (ffgcprll(fptr, colnum, firstrow, firstelem, nelem, readcheck, &scale, &zero,
         tform, &twidth, &tcode, &maxelem2, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0 )
         return(*status);
    maxelem = maxelem2;

    incre *= elemincre;   /* multiply incre to just get every nth pixel */

    if (tcode == TSTRING)    /* setup for ASCII tables */
    {
      /* get the number of implied decimal places if no explicit decmal point */
      ffasfm(tform, &xcode, &xwidth, &decimals, status); 
      for(ii = 0; ii < decimals; ii++)
        power *= 10.;
    }
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (tcode%10 == 1 &&        /* if reading an integer column, and  */ 
            tnull == NULL_UNDEFINED) /* if a null value is not defined,    */
            nulcheck = 0;            /* then do not check for null values. */

    else if (tcode == TSHORT && (tnull > SHRT_MAX || tnull < SHRT_MIN) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TBYTE && (tnull > 255 || tnull < 0) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TSTRING && snull[0] == ASCII_NULL_UNDEFINED)
         nulcheck = 0;

    /*----------------------------------------------------------------------*/
    /*  If FITS column and output data array have same datatype, then we do */
    /*  not need to use a temporary buffer to store intermediate datatype.  */
    /*----------------------------------------------------------------------*/
    convert = 1;
    if ((tcode == TLONG) && (LONGSIZE == 32))  /* Special Case:                        */
    {                             /* no type convertion required, so read */
                                  /* data directly into output buffer.    */

        if (nelem < (LONGLONG)INT32_MAX/4) {
            maxelem = nelem;
        } else {
            maxelem = INT32_MAX/4;   
        }

        if (nulcheck == 0 && scale == 1. && zero == 0. )
            convert = 0;  /* no need to scale data or find nulls */
    }

    /*---------------------------------------------------------------------*/
    /*  Now read the pixels from the FITS column. If the column does not   */
    /*  have the same datatype as the output array, then we have to read   */
    /*  the raw values into a temporary buffer (of limited size).  In      */
    /*  the case of a vector colum read only 1 vector of values at a time  */
    /*  then skip to the next row if more values need to be read.          */
    /*  After reading the raw values, then call the fffXXYY routine to (1) */
    /*  test for undefined values, (2) convert the datatype if necessary,  */
    /*  and (3) scale the values by the FITS TSCALn and TZEROn linear      */
    /*  scaling parameters.                                                */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */

    while (remain)
    {
        /* limit the number of pixels to read at one time to the number that
           will fit in the buffer or to the number of pixels that remain in
           the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);
        if (elemincre >= 0)
        {
          ntodo = (long) minvalue(ntodo, ((repeat - elemnum - 1)/elemincre +1));
        }
        else
        {
          ntodo = (long) minvalue(ntodo, (elemnum/(-elemincre) +1));
        }

        readptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * (incre / elemincre));

        switch (tcode) 
        {
            case (TLONG):
	      if (LONGSIZE == 32) {
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) &array[next],
                       status);
                if (convert)
                    fffi4i4((INT32BIT *) &array[next], ntodo, scale, zero, 
                           nulcheck, (INT32BIT) tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
	      } else { /* case where sizeof(long) = 8 */
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) buffer,
                       status);
                if (convert)
                    fffi4i4((INT32BIT *) buffer, ntodo, scale, zero, 
                           nulcheck, (INT32BIT) tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
	      }

                break;
            case (TLONGLONG):
                ffgi8b(fptr, readptr, ntodo, incre, (long *) buffer, status);
                fffi8i4((LONGLONG *) buffer, ntodo, scale, zero, 
                           nulcheck, tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
                break;
            case (TBYTE):
                ffgi1b(fptr, readptr, ntodo, incre, (unsigned char *) buffer,
                       status);
                fffi1i4((unsigned char *) buffer, ntodo, scale, zero, nulcheck, 
                     (unsigned char) tnull, nulval, &nularray[next], anynul, 
                     &array[next], status);
                break;
            case (TSHORT):
                ffgi2b(fptr, readptr, ntodo, incre, (short  *) buffer, status);
                fffi2i4((short  *) buffer, ntodo, scale, zero, nulcheck, 
                      (short) tnull, nulval, &nularray[next], anynul, 
                      &array[next], status);
                break;
            case (TFLOAT):
                ffgr4b(fptr, readptr, ntodo, incre, (float  *) buffer, status);
                fffr4i4((float  *) buffer, ntodo, scale, zero, nulcheck, 
                       nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TDOUBLE):
                ffgr8b(fptr, readptr, ntodo, incre, (double *) buffer, status);
                fffr8i4((double *) buffer, ntodo, scale, zero, nulcheck, 
                          nulval, &nularray[next], anynul, 
                          &array[next], status);
                break;
            case (TSTRING):
                ffmbyt(fptr, readptr, REPORT_EOF, status);
       
                if (incre == twidth)    /* contiguous bytes */
                     ffgbyt(fptr, ntodo * twidth, buffer, status);
                else
                     ffgbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                fffstri4((char *) buffer, ntodo, scale, zero, twidth, power,
                     nulcheck, snull, nulval, &nularray[next], anynul,
                     &array[next], status);
                break;

            default:  /*  error trap for invalid column format */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot read numbers from column %d which has format %s",
                    colnum, tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous read operation */
        {
	  dtemp = (double) next;
          if (hdutype > 0)
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from column %d (ffgclj).",
              dtemp+1., dtemp+ntodo, colnum);
          else
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from image (ffgclj).",
              dtemp+1., dtemp+ntodo);

          ffpmsg(message);
          return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum = elemnum + (ntodo * elemincre);

            if (elemnum >= repeat)  /* completed a row; start on later row */
            {
                rowincre = elemnum / repeat;
                rownum += rowincre;
                elemnum = elemnum - (rowincre * repeat);
            }
            else if (elemnum < 0)  /* completed a row; start on a previous row */
            {
                rowincre = (-elemnum - 1) / repeat + 1;
                rownum -= rowincre;
                elemnum = (rowincre * repeat) + elemnum;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while reading FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}